

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O0

bool __thiscall
booster::regex::match
          (regex *this,char *begin,char *end,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *marks,int param_5)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  data *pdVar4;
  undefined8 uVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  copy_ptr<booster::regex::data> *in_RDI;
  int i;
  int res;
  vector<int,_std::allocator<int>_> ovec;
  int pat_size;
  string *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator_type *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  value_type in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  value_type vVar9;
  undefined4 in_stack_fffffffffffffedc;
  value_type *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_fffffffffffffee8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffef0;
  pcre *ppVar10;
  int local_ac;
  vector<int,_std::allocator<int>_> local_98;
  int local_7c [2];
  pair<int,_int> local_74;
  int local_6c;
  undefined1 local_65;
  allocator local_51;
  string local_50 [40];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_28;
  long local_20;
  long local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  if (pdVar4->are == (pcre *)0x0) {
    local_65 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"booster::regex: Empty expression",&local_51);
    regex_error::regex_error
              ((regex_error *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    local_65 = 0;
    __cxa_throw(uVar5,&regex_error::typeinfo,regex_error::~regex_error);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x2a92da);
  uVar2 = mark_count((regex *)in_stack_fffffffffffffeb8);
  local_6c = uVar2 + 1;
  local_7c[1] = 0xffffffff;
  local_7c[0] = -1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_74,local_7c + 1,local_7c);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  mark_count((regex *)in_stack_fffffffffffffeb8);
  std::allocator<int>::allocator((allocator<int> *)0x2a938d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  std::allocator<int>::~allocator((allocator<int> *)0x2a93bb);
  pdVar4 = copy_ptr<booster::regex::data>::operator->(in_RDI);
  lVar1 = local_18;
  ppVar10 = pdVar4->are;
  iVar3 = (int)local_20 - (int)local_18;
  this_00 = &local_98;
  pvVar6 = std::vector<int,_std::allocator<int>_>::front
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00);
  iVar3 = pcre_exec(ppVar10,0,lVar1,iVar3,0,0x10,pvVar6,(int)sVar7);
  if (iVar3 < 0) {
    local_1 = 0;
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,0);
    if ((*pvVar6 == 0) &&
       (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,1),
       (long)*pvVar6 == local_20 - local_18)) {
      for (local_ac = 0; local_ac < local_6c && local_ac < iVar3; local_ac = local_ac + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)(local_ac << 1))
        ;
        in_stack_fffffffffffffed4 = *pvVar6;
        pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (local_28,(long)local_ac);
        pvVar8->first = in_stack_fffffffffffffed4;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_98,(long)(local_ac * 2 + 1));
        vVar9 = *pvVar6;
        pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (local_28,(long)local_ac);
        pvVar8->second = vVar9;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return (bool)(local_1 & 1);
}

Assistant:

bool regex::match(char const *begin,char const *end,std::vector<std::pair<int,int> > &marks,int /*flags*/) const
	{
		if(!d->are)
			throw regex_error("booster::regex: Empty expression");
		marks.clear();
		int pat_size = mark_count() + 1;
		marks.resize(pat_size,std::pair<int,int>(-1,-1));

		std::vector<int> ovec((mark_count()+1)*3,0);
		int res = pcre_exec(d->are,0,begin,end-begin,0,PCRE_ANCHORED,&ovec.front(),ovec.size());
		if(res < 0)
			return false;
		if(ovec[0]!=0 || ovec[1]!=end-begin)
			return false;
		for(int i=0;i<pat_size && i < res;i++) {
			marks[i].first=ovec[i*2];
			marks[i].second = ovec[i*2+1];
		}
		return true;
	}